

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall c4::yml::Parser::_line_ended(Parser *this)

{
  code *pcVar1;
  size_t sVar2;
  Location LVar3;
  bool bVar4;
  State *pSVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char msg [74];
  char local_58 [72];
  undefined2 local_10;
  
  pSVar5 = this->m_state;
  sVar7 = (pSVar5->line_contents).stripped.len;
  if ((pSVar5->pos).super_LineCol.col != sVar7 + 1) {
    pcVar8 = "check failed: (m_state->pos.col == m_state->line_contents.stripped.len+1)";
    pcVar9 = local_58;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined8 *)pcVar9 = *(undefined8 *)pcVar8;
      pcVar8 = pcVar8 + 8;
      pcVar9 = pcVar9 + 8;
    }
    local_10 = 0x29;
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
    }
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x76a6) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x76a6) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_58,0x4a,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar5 = this->m_state;
    sVar7 = (pSVar5->line_contents).stripped.len;
  }
  sVar2 = (pSVar5->pos).super_LineCol.line;
  (pSVar5->pos).super_LineCol.offset =
       ((pSVar5->line_contents).full.len - sVar7) + (pSVar5->pos).super_LineCol.offset;
  (pSVar5->pos).super_LineCol.line = sVar2 + 1;
  (pSVar5->pos).super_LineCol.col = 1;
  return;
}

Assistant:

void Parser::_line_ended()
{
    _c4dbgpf("line[{}] ({} cols) ended! offset {}-->{}", m_state->pos.line, m_state->line_contents.full.len, m_state->pos.offset, m_state->pos.offset+m_state->line_contents.full.len - m_state->line_contents.stripped.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->pos.col == m_state->line_contents.stripped.len+1);
    m_state->pos.offset += m_state->line_contents.full.len - m_state->line_contents.stripped.len;
    ++m_state->pos.line;
    m_state->pos.col = 1;
}